

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH128_hash_t
XXH3_128bits_internal
          (void *input,size_t len,XXH64_hash_t seed64,void *secret,size_t secretLen,
          XXH3_hashLong128_f f_hl128)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  xxh_u8 *pxVar8;
  ulong uVar9;
  uint uVar10;
  xxh_u8 *pxVar11;
  long lVar12;
  XXH128_hash_t acc;
  XXH128_hash_t acc_00;
  XXH128_hash_t acc_01;
  XXH128_hash_t acc_02;
  XXH128_hash_t XVar13;
  XXH128_hash_t XVar14;
  XXH128_hash_t acc_03;
  
  if (len < 0x11) {
    if (len < 9) {
      if (len < 4) {
        if (len == 0) {
          uVar9 = *(ulong *)((long)secret + 0x40) ^ *(ulong *)((long)secret + 0x48) ^ seed64;
          uVar9 = (uVar9 >> 0x21 ^ uVar9) * -0x3d4d51c2d82b14b1;
          uVar9 = (uVar9 >> 0x1d ^ uVar9) * 0x165667b19e3779f9;
          uVar9 = uVar9 >> 0x20 ^ uVar9;
          uVar5 = *(ulong *)((long)secret + 0x50) ^ *(ulong *)((long)secret + 0x58) ^ seed64;
          uVar5 = (uVar5 >> 0x21 ^ uVar5) * -0x3d4d51c2d82b14b1;
          uVar5 = uVar5 >> 0x1d ^ uVar5;
        }
        else {
          uVar6 = (int)len << 8;
          uVar7 = uVar6 | (uint)*input << 0x10 | (uint)*(byte *)((long)input + (len >> 1)) << 0x18;
          uVar10 = (uint)*(byte *)((long)input + (len - 1));
          uVar6 = uVar7 >> 0x18 | (uVar6 & 0xff0000 | (uint)*input << 0x10) >> 8 |
                  (uVar6 & 0xff00) << 8;
          uVar9 = (*(uint *)((long)secret + 4) ^ *secret) + seed64;
          uVar5 = (*(uint *)((long)secret + 0xc) ^ *(uint *)((long)secret + 8)) - seed64;
          uVar9 = (uVar9 >> 0x21 ^ uVar9 ^ (ulong)(uVar7 | uVar10)) * -0x3d4d51c2d82b14b1;
          uVar9 = (uVar9 >> 0x1d ^ uVar9) * 0x165667b19e3779f9;
          uVar9 = uVar9 >> 0x20 ^ uVar9;
          uVar5 = (uVar5 >> 0x21 ^ uVar5 ^ (ulong)(uVar6 << 0xd | (uVar6 | uVar10 << 0x18) >> 0x13))
                  * -0x3d4d51c2d82b14b1;
          uVar5 = uVar5 >> 0x1d ^ uVar5;
        }
        uVar5 = uVar5 * 0x165667b19e3779f9;
      }
      else {
        uVar6 = (uint)seed64;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (*(ulong *)((long)secret + 0x18) ^ *(ulong *)((long)secret + 0x10)) +
                       ((ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                               uVar6 << 0x18) << 0x20 ^ seed64) ^
                       CONCAT44(*(undefined4 *)((long)input + (len - 4)),*input);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = len * 4 + 0x9e3779b185ebca87;
        uVar9 = SUB168(auVar3 * auVar4,0);
        uVar5 = SUB168(auVar3 * auVar4,8) + uVar9 * 2;
        uVar9 = uVar5 >> 3 ^ uVar9;
        uVar9 = (uVar9 >> 0x23 ^ uVar9) * -0x604de39ae16720db;
        uVar9 = uVar9 >> 0x1c ^ uVar9;
        uVar5 = (uVar5 >> 0x25 ^ uVar5) * 0x165667919e3779f9;
      }
    }
    else {
      uVar9 = *(ulong *)((long)input + (len - 8));
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (*(ulong *)((long)secret + 0x28) ^ *(ulong *)((long)secret + 0x20)) - seed64 ^
                     *input ^ uVar9;
      uVar9 = (*(ulong *)((long)secret + 0x38) ^ *(ulong *)((long)secret + 0x30)) + seed64 ^ uVar9;
      uVar5 = (uVar9 & 0xffffffff) * 0x85ebca76 + uVar9 +
              SUB168(auVar1 * ZEXT816(0x9e3779b185ebca87),8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = SUB168(auVar1 * ZEXT816(0x9e3779b185ebca87),0) +
                     (len << 0x36) + -0x40000000000000 ^
                     (uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                      (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                      (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                      (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38);
      uVar9 = SUB168(auVar2 * ZEXT816(0xc2b2ae3d27d4eb4f),0);
      uVar5 = uVar5 * -0x3d4d51c2d82b14b1 + SUB168(auVar2 * ZEXT816(0xc2b2ae3d27d4eb4f),8);
      uVar9 = (uVar9 >> 0x25 ^ uVar9) * 0x165667919e3779f9;
      uVar9 = uVar9 >> 0x20 ^ uVar9;
      uVar5 = (uVar5 >> 0x25 ^ uVar5) * 0x165667919e3779f9;
    }
    uVar5 = uVar5 >> 0x20 ^ uVar5;
  }
  else {
    if (len < 0x81) {
      acc_03.low64 = len * -0x61c8864e7a143579;
      if (len < 0x21) {
        acc_02.high64 = 0;
        acc_02.low64 = acc_03.low64;
      }
      else {
        if (len < 0x41) {
          acc_01.high64 = 0;
          acc_01.low64 = acc_03.low64;
        }
        else {
          if (len < 0x61) {
            acc.high64 = 0;
            acc.low64 = acc_03.low64;
          }
          else {
            acc_03.high64 = 0;
            acc = XXH128_mix32B(acc_03,(xxh_u8 *)((long)input + 0x30),
                                (xxh_u8 *)((long)input + (len - 0x40)),
                                (xxh_u8 *)((long)secret + 0x60),seed64);
          }
          acc_01 = XXH128_mix32B(acc,(xxh_u8 *)((long)input + 0x20),
                                 (xxh_u8 *)((long)input + (len - 0x30)),
                                 (xxh_u8 *)((long)secret + 0x40),seed64);
        }
        acc_02 = XXH128_mix32B(acc_01,(xxh_u8 *)((long)input + 0x10),
                               (xxh_u8 *)((long)input + (len - 0x20)),
                               (xxh_u8 *)((long)secret + 0x20),seed64);
      }
      XVar13 = XXH128_mix32B(acc_02,(xxh_u8 *)input,(xxh_u8 *)((long)input + (len - 0x10)),
                             (xxh_u8 *)secret,seed64);
      uVar9 = XVar13.low64 + XVar13.high64;
      uVar5 = (len - seed64) * -0x3d4d51c2d82b14b1 + XVar13.high64 * -0x7a1435883d4d519d +
              XVar13.low64 * -0x61c8864e7a143579;
      uVar9 = (uVar9 >> 0x25 ^ uVar9) * 0x165667919e3779f9;
      uVar9 = uVar9 >> 0x20 ^ uVar9;
      uVar5 = (uVar5 >> 0x25 ^ uVar5) * 0x165667919e3779f9;
      uVar5 = uVar5 >> 0x20 ^ uVar5;
    }
    else {
      if (0xf0 < len) {
        XVar13 = (*f_hl128)(input,len,seed64,secret,secretLen);
        return XVar13;
      }
      lVar12 = 4;
      XVar13.high64 = 0;
      XVar13.low64 = len * -0x61c8864e7a143579;
      pxVar8 = (xxh_u8 *)secret;
      pxVar11 = (xxh_u8 *)input;
      do {
        XVar13 = XXH128_mix32B(XVar13,pxVar11,pxVar11 + 0x10,pxVar8,seed64);
        pxVar8 = pxVar8 + 0x20;
        pxVar11 = pxVar11 + 0x20;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar9 = (XVar13.low64 >> 0x25 ^ XVar13.low64) * 0x165667919e3779f9;
      uVar5 = (XVar13.high64 >> 0x25 ^ XVar13.high64) * 0x165667919e3779f9;
      acc_00.high64 = uVar5 >> 0x20 ^ uVar5;
      acc_00.low64 = uVar9 >> 0x20 ^ uVar9;
      if (0x9f < len) {
        uVar6 = (uint)(len >> 5) & 0x7ffffff;
        uVar9 = 5;
        if (5 < uVar6) {
          uVar9 = (ulong)uVar6;
        }
        lVar12 = uVar9 - 4;
        pxVar8 = (xxh_u8 *)((long)secret + 3);
        pxVar11 = (xxh_u8 *)((long)input + 0x80);
        do {
          acc_00 = XXH128_mix32B(acc_00,pxVar11,pxVar11 + 0x10,pxVar8,seed64);
          pxVar8 = pxVar8 + 0x20;
          pxVar11 = pxVar11 + 0x20;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      XVar13 = XXH128_mix32B(acc_00,(xxh_u8 *)((long)input + (len - 0x10)),
                             (xxh_u8 *)((long)input + (len - 0x20)),(xxh_u8 *)((long)secret + 0x67),
                             -seed64);
      uVar9 = XVar13.low64 + XVar13.high64;
      uVar5 = (len - seed64) * -0x3d4d51c2d82b14b1 + XVar13.high64 * -0x7a1435883d4d519d +
              XVar13.low64 * -0x61c8864e7a143579;
      uVar9 = (uVar9 >> 0x25 ^ uVar9) * 0x165667919e3779f9;
      uVar9 = uVar9 >> 0x20 ^ uVar9;
      uVar5 = (uVar5 >> 0x25 ^ uVar5) * 0x165667919e3779f9;
      uVar5 = uVar5 >> 0x20 ^ uVar5;
    }
    uVar5 = -uVar5;
  }
  XVar14.high64 = uVar5;
  XVar14.low64 = uVar9;
  return XVar14;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH3_128bits_internal(const void* input, size_t len, XXH64_hash_t seed64,
                      const void* XXH_RESTRICT secret, size_t secretLen,
                      XXH3_hashLong128_f f_hl128) {
  XXH_ASSERT(secretLen >= XXH3_SECRET_SIZE_MIN);
  /*
   * If an action is to be taken if `secret` conditions are not respected,
   * it should be done here.
   * For now, it's a contract pre-condition.
   * Adding a check and a branch here would cost performance at every hash.
   */
  if (len <= 16)
    return XXH3_len_0to16_128b((const xxh_u8*)input, len, (const xxh_u8*)secret,
                               seed64);
  if (len <= 128)
    return XXH3_len_17to128_128b((const xxh_u8*)input, len,
                                 (const xxh_u8*)secret, secretLen, seed64);
  if (len <= XXH3_MIDSIZE_MAX)
    return XXH3_len_129to240_128b((const xxh_u8*)input, len,
                                  (const xxh_u8*)secret, secretLen, seed64);
  return f_hl128(input, len, seed64, secret, secretLen);
}